

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O2

int Cudd_zddDumpDot(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int *piVar1;
  FILE *pFVar2;
  int iVar3;
  void *__ptr;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  st__table *table;
  st__generator *gen;
  DdNode **ppDVar6;
  uint uVar7;
  ulong uVar8;
  DdNode **ppDVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  char *__format;
  DdManager *pDVar11;
  DdNode **ppDVar12;
  DdNode *local_80;
  FILE *local_78;
  DdNode **local_70;
  DdNode **local_68;
  DdNode **local_60;
  DdManager *local_58;
  DdNode **local_50;
  DdNode **local_48;
  DdNode **local_40;
  char **local_38;
  
  local_70 = (DdNode **)CONCAT44(in_register_00000034,n);
  uVar7 = dd->sizeZ;
  local_68 = f;
  __ptr = malloc((long)(int)uVar7 * 4);
  if (__ptr == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    ppDVar4 = (DdNode **)0x0;
    ppDVar12 = (DdNode **)(ulong)uVar7;
    if ((int)uVar7 < 1) {
      ppDVar12 = ppDVar4;
    }
    for (; ppDVar12 != ppDVar4; ppDVar4 = (DdNode **)((long)ppDVar4 + 1)) {
      *(undefined4 *)((long)__ptr + (long)ppDVar4 * 4) = 0;
    }
    table = (st__table *)0x0;
    local_60 = (DdNode **)0x0;
    if (0 < (int)local_70) {
      local_60 = (DdNode **)((ulong)local_70 & 0xffffffff);
    }
    local_50 = (DdNode **)inames;
    local_38 = onames;
    for (ppDVar4 = (DdNode **)0x0; ppDVar4 != local_60; ppDVar4 = (DdNode **)((long)ppDVar4 + 1)) {
      pDVar5 = Cudd_Support(dd,local_68[(long)ppDVar4]);
      if (pDVar5 == (DdNode *)0x0) goto LAB_0067cbe3;
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      for (local_80 = pDVar5; (ulong)local_80->index != 0x7fffffff;
          local_80 = (local_80->type).kids.T) {
        *(undefined4 *)((long)__ptr + (ulong)local_80->index * 4) = 1;
      }
      Cudd_RecursiveDeref(dd,pDVar5);
    }
    table = st__init_table(st__ptrcmp,st__ptrhash);
    if (table != (st__table *)0x0) {
      ppDVar4 = (DdNode **)0x0;
      while (local_60 != ppDVar4) {
        iVar3 = cuddCollectNodes(local_68[(long)ppDVar4],table);
        ppDVar4 = (DdNode **)((long)ppDVar4 + 1);
        if (iVar3 == 0) goto LAB_0067cbe3;
      }
      pDVar5 = *local_68;
      local_78 = (FILE *)fp;
      local_58 = dd;
      gen = st__init_gen(table);
      uVar8 = 0;
      ppDVar4 = &local_80;
      while (iVar3 = st__gen(gen,(char **)ppDVar4,(char **)0x0), iVar3 != 0) {
        uVar8 = uVar8 | (ulong)local_80 ^ (ulong)pDVar5;
      }
      st__free_gen(gen);
      pFVar2 = local_78;
      uVar7 = 0;
      do {
        if (0x3f < uVar7) break;
        ppDVar4 = (DdNode **)(ulong)(uint)~(-1 << ((byte)uVar7 & 0x1f));
        uVar7 = uVar7 + 4;
      } while ((long)ppDVar4 < (long)uVar8);
      iVar3 = fprintf(local_78,"digraph \"ZDD\" {\n");
      if (iVar3 == -1) {
        return 0;
      }
      iVar3 = fprintf(pFVar2,"size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
      if (iVar3 == -1) {
        return 0;
      }
      iVar3 = fprintf(pFVar2,"{ node [shape = plaintext];\n");
      if (((iVar3 == -1) || (iVar3 = fprintf(pFVar2,"  edge [style = invis];\n"), iVar3 == -1)) ||
         (iVar3 = fprintf(pFVar2,"  \"CONST NODES\" [style = invis];\n"), iVar3 == -1))
      goto LAB_0067cbe3;
      for (ppDVar9 = (DdNode **)0x0; ppDVar12 != ppDVar9; ppDVar9 = (DdNode **)((long)ppDVar9 + 1))
      {
        if (*(int *)((long)__ptr + (long)local_58->invpermZ[(long)ppDVar9] * 4) != 0) {
          if (local_50 == (DdNode **)0x0) {
            iVar3 = fprintf(pFVar2,"\" %d \" -> ");
          }
          else {
            iVar3 = fprintf(pFVar2,"\" %s \" -> ",local_50[local_58->invpermZ[(long)ppDVar9]]);
          }
          if (iVar3 == -1) goto LAB_0067cbe3;
        }
      }
      iVar3 = fprintf(pFVar2,"\"CONST NODES\"; \n}\n");
      if ((iVar3 != -1) &&
         (iVar3 = fprintf(pFVar2,"{ rank = same; node [shape = box]; edge [style = invis];\n"),
         iVar3 != -1)) {
        local_70 = (DdNode **)(ulong)((int)local_70 - 1);
        ppDVar9 = (DdNode **)0x0;
        while (local_60 != ppDVar9) {
          if (local_38 == (char **)0x0) {
            iVar3 = fprintf(pFVar2,"\"F%d\"",(ulong)ppDVar9 & 0xffffffff);
          }
          else {
            iVar3 = fprintf(pFVar2,"\"  %s  \"",local_38[(long)ppDVar9]);
          }
          if (iVar3 == -1) goto LAB_0067cbe3;
          __format = " -> ";
          if (local_70 == ppDVar9) {
            __format = "; }\n";
          }
          iVar3 = fprintf(pFVar2,__format);
          ppDVar9 = (DdNode **)((long)ppDVar9 + 1);
          if (iVar3 == -1) goto LAB_0067cbe3;
        }
        pDVar11 = local_58;
        for (ppDVar9 = (DdNode **)0x0; ppDVar9 != ppDVar12; ppDVar9 = (DdNode **)((long)ppDVar9 + 1)
            ) {
          if (*(int *)((long)__ptr + (long)pDVar11->invpermZ[(long)ppDVar9] * 4) != 0) {
            local_48 = ppDVar9;
            iVar3 = fprintf(pFVar2,"{ rank = same; ");
            if (iVar3 == -1) goto LAB_0067cbe3;
            if (local_50 == (DdNode **)0x0) {
              iVar3 = fprintf(pFVar2,"\" %d \";\n");
            }
            else {
              iVar3 = fprintf(pFVar2,"\" %s \";\n",local_50[pDVar11->invpermZ[(long)local_48]]);
            }
            if (iVar3 == -1) goto LAB_0067cbe3;
            local_40 = pDVar11->subtableZ[(long)local_48].nodelist;
            uVar7 = pDVar11->subtableZ[(long)local_48].slots;
            if ((int)uVar7 < 1) {
              uVar7 = 0;
            }
            ppDVar9 = (DdNode **)0x0;
            while (ppDVar9 != (DdNode **)(ulong)uVar7) {
              ppDVar6 = local_40 + (long)ppDVar9;
              local_70 = ppDVar9;
              while (local_80 = *ppDVar6, local_80 != (DdNode *)0x0) {
                iVar3 = st__lookup(table,(char *)local_80,(char **)0x0);
                if ((iVar3 != 0) &&
                   (iVar3 = fprintf(pFVar2,"\"%p\";\n",((ulong)local_80 & (ulong)ppDVar4) / 0x28),
                   iVar3 == -1)) goto LAB_0067cbe3;
                ppDVar6 = &local_80->next;
              }
              ppDVar9 = (DdNode **)((long)local_70 + 1);
            }
            iVar3 = fprintf(pFVar2,"}\n");
            ppDVar9 = local_48;
            pDVar11 = local_58;
            if (iVar3 == -1) goto LAB_0067cbe3;
          }
        }
        iVar3 = fprintf(pFVar2,"{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
        pFVar2 = local_78;
        if (iVar3 != -1) {
          local_40 = (local_58->constants).nodelist;
          uVar7 = (local_58->constants).slots;
          local_50 = (DdNode **)(ulong)uVar7;
          if ((int)uVar7 < 1) {
            local_50 = (DdNode **)0x0;
          }
          ppDVar9 = (DdNode **)0x0;
          while (ppDVar9 != local_50) {
            ppDVar6 = local_40 + (long)ppDVar9;
            local_70 = ppDVar9;
            while (local_80 = *ppDVar6, local_80 != (DdNode *)0x0) {
              iVar3 = st__lookup(table,(char *)local_80,(char **)0x0);
              if ((iVar3 != 0) &&
                 (iVar3 = fprintf(pFVar2,"\"%p\";\n",((ulong)local_80 & (ulong)ppDVar4) / 0x28),
                 iVar3 == -1)) goto LAB_0067cbe3;
              ppDVar6 = &local_80->next;
            }
            ppDVar9 = (DdNode **)((long)local_70 + 1);
          }
          iVar3 = fprintf(local_78,"}\n}\n");
          if (iVar3 == -1) goto LAB_0067cbe3;
          ppDVar9 = (DdNode **)0x0;
          do {
            if (local_60 == ppDVar9) {
              for (local_68 = (DdNode **)0x0; local_68 != ppDVar12;
                  local_68 = (DdNode **)((long)local_68 + 1)) {
                if (*(int *)((long)__ptr + (long)local_58->invpermZ[(long)local_68] * 4) != 0) {
                  local_70 = local_58->subtableZ[(long)local_68].nodelist;
                  uVar7 = local_58->subtableZ[(long)local_68].slots;
                  if ((int)uVar7 < 1) {
                    uVar7 = 0;
                  }
                  for (local_60 = (DdNode **)0x0; local_60 != (DdNode **)(ulong)uVar7;
                      local_60 = (DdNode **)((long)local_60 + 1)) {
                    ppDVar9 = local_70 + (long)local_60;
                    while (local_80 = *ppDVar9, local_80 != (DdNode *)0x0) {
                      iVar3 = st__lookup(table,(char *)local_80,(char **)0x0);
                      if ((iVar3 != 0) &&
                         ((iVar3 = fprintf(local_78,"\"%p\" -> \"%p\";\n",
                                           ((ulong)ppDVar4 & (ulong)local_80) / 0x28,
                                           ((ulong)(local_80->type).kids.T & (ulong)ppDVar4) / 0x28)
                          , iVar3 == -1 ||
                          (iVar3 = fprintf(local_78,"\"%p\" -> \"%p\" [style = dashed];\n",
                                           ((ulong)ppDVar4 & (ulong)local_80) / 0x28,
                                           ((ulong)(local_80->type).kids.E & (ulong)ppDVar4) / 0x28)
                          , iVar3 == -1)))) goto LAB_0067cbe3;
                      ppDVar9 = &local_80->next;
                    }
                  }
                }
              }
              ppDVar12 = (local_58->constants).nodelist;
              uVar7 = (local_58->constants).slots;
              uVar10 = 0;
              uVar8 = (ulong)uVar7;
              if ((int)uVar7 < 1) {
                uVar8 = uVar10;
              }
              for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
                ppDVar9 = ppDVar12 + uVar10;
                while (local_80 = *ppDVar9, local_80 != (DdNode *)0x0) {
                  iVar3 = st__lookup(table,(char *)local_80,(char **)0x0);
                  if ((iVar3 != 0) &&
                     (iVar3 = fprintf(local_78,"\"%p\" [label = \"%g\"];\n",(local_80->type).value,
                                      ((ulong)ppDVar4 & (ulong)local_80) / 0x28), iVar3 == -1))
                  goto LAB_0067cbe3;
                  ppDVar9 = &local_80->next;
                }
              }
              iVar3 = fprintf(local_78,"}\n");
              if (iVar3 != -1) {
                st__free_table(table);
                free(__ptr);
                return 1;
              }
              break;
            }
            if (local_38 == (char **)0x0) {
              iVar3 = fprintf(local_78,"\"F%d\"",(ulong)ppDVar9 & 0xffffffff);
            }
            else {
              iVar3 = fprintf(local_78,"\"  %s  \"",local_38[(long)ppDVar9]);
            }
            if (iVar3 == -1) break;
            iVar3 = fprintf(local_78," -> \"%p\" [style = solid];\n",
                            ((ulong)local_68[(long)ppDVar9] & (ulong)ppDVar4) / 0x28);
            ppDVar9 = (DdNode **)((long)ppDVar9 + 1);
          } while (iVar3 != -1);
        }
      }
      goto LAB_0067cbe3;
    }
  }
  table = (st__table *)0x0;
LAB_0067cbe3:
  free(__ptr);
  if (table != (st__table *)0x0) {
    st__free_table(table);
  }
  return 0;
}

Assistant:

int
Cudd_zddDumpDot(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->sizeZ;
    st__table    *visited = NULL;
    st__generator *gen;
    int         retval;
    int         i, j;
    int         slots;
    DdNodePtr   *nodelist;
    long        refAddr, diff, mask;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    for (i = 0; i < n; i++) {
        support = Cudd_Support(dd,f[i]);
        if (support == NULL) goto failure;
        cuddRef(support);
        scan = support;
        while (!cuddIsConstant(scan)) {
            sorted[scan->index] = 1;
            scan = cuddT(scan);
        }
        Cudd_RecursiveDeref(dd,support);
    }
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(f[i],visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (long) f[0];
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (long) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(long); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }

    /* Write the header and the global attributes. */
    retval = fprintf(fp,"digraph \"ZDD\" {\n");
    if (retval == EOF) return(0);
    retval = fprintf(fp,
        "size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
    if (retval == EOF) return(0);

    /* Write the input name subgraph by scanning the support array. */
    retval = fprintf(fp,"{ node [shape = plaintext];\n");
    if (retval == EOF) goto failure;
    retval = fprintf(fp,"  edge [style = invis];\n");
    if (retval == EOF) goto failure;
    /* We use a name ("CONST NODES") with an embedded blank, because
    ** it is unlikely to appear as an input name.
    */
    retval = fprintf(fp,"  \"CONST NODES\" [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invpermZ[i]]) {
            if (inames == NULL) {
                retval = fprintf(fp,"\" %d \" -> ", dd->invpermZ[i]);
            } else {
                retval = fprintf(fp,"\" %s \" -> ", inames[dd->invpermZ[i]]);
            }
            if (retval == EOF) goto failure;
        }
    }
    retval = fprintf(fp,"\"CONST NODES\"; \n}\n");
    if (retval == EOF) goto failure;

    /* Write the output node subgraph. */
    retval = fprintf(fp,"{ rank = same; node [shape = box]; edge [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        if (i == n - 1) {
            retval = fprintf(fp,"; }\n");
        } else {
            retval = fprintf(fp," -> ");
        }
        if (retval == EOF) goto failure;
    }

    /* Write rank info: All nodes with the same index have the same rank. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invpermZ[i]]) {
            retval = fprintf(fp,"{ rank = same; ");
            if (retval == EOF) goto failure;
            if (inames == NULL) {
                retval = fprintf(fp,"\" %d \";\n", dd->invpermZ[i]);
            } else {
                retval = fprintf(fp,"\" %s \";\n", inames[dd->invpermZ[i]]);
            }
            if (retval == EOF) goto failure;
            nodelist = dd->subtableZ[i].nodelist;
            slots = dd->subtableZ[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp,"\"%p\";\n", (void *)
                                         ((mask & (ptrint) scan) /
                                          sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
            retval = fprintf(fp,"}\n");
            if (retval == EOF) goto failure;
        }
    }

    /* All constants have the same rank. */
    retval = fprintf(fp,
        "{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
    if (retval == EOF) goto failure;
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%p\";\n", (void *)
                                 ((mask & (ptrint) scan) / sizeof(DdNode)));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }
    retval = fprintf(fp,"}\n}\n");
    if (retval == EOF) goto failure;

    /* Write edge info. */
    /* Edges from the output nodes. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp," -> \"%p\" [style = solid];\n",
                         (void *) ((mask & (ptrint) f[i]) /
                                          sizeof(DdNode)));
        if (retval == EOF) goto failure;
    }

    /* Edges from internal nodes. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invpermZ[i]]) {
            nodelist = dd->subtableZ[i].nodelist;
            slots = dd->subtableZ[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp,
                            "\"%p\" -> \"%p\";\n",
                            (void *) ((mask & (ptrint) scan) / sizeof(DdNode)),
                            (void *) ((mask & (ptrint) cuddT(scan)) /
                                      sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                        retval = fprintf(fp,
                                         "\"%p\" -> \"%p\" [style = dashed];\n",
                                         (void *) ((mask & (ptrint) scan)
                                                   / sizeof(DdNode)),
                                         (void *) ((mask & (ptrint)
                                                    cuddE(scan)) /
                                                   sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
        }
    }

    /* Write constant labels. */
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%p\" [label = \"%g\"];\n",
                                 (void *) ((mask & (ptrint) scan) /
                                           sizeof(DdNode)),
                                 cuddV(scan));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }

    /* Write trailer and return. */
    retval = fprintf(fp,"}\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    ABC_FREE(sorted);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (visited != NULL) st__free_table(visited);
    return(0);

}